

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_active)

{
  sunrealtype ***pppsVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  
  iVar2 = -0x16;
  if ((MRIC != (MRIStepCoupling)0x0) &&
     (((pppsVar1 = MRIC->W, pppsVar1 != (sunrealtype ***)0x0 || (MRIC->G != (sunrealtype ***)0x0))
      && (nstages_active != (int *)0x0 && stage_map != (int *)0x0)))) {
    if (MRIC->type - MRISTEP_MERK < 2) {
      iVar6 = MRIC->stages;
      *nstages_active = iVar6;
      for (lVar3 = 0; iVar2 = 0, lVar3 < iVar6; lVar3 = lVar3 + 1) {
        stage_map[lVar3] = (int)lVar3;
        iVar6 = MRIC->stages;
      }
    }
    else {
      *nstages_active = 0;
      lVar3 = 0;
      iVar6 = 0;
      while( true ) {
        iVar2 = MRIC->stages;
        if (iVar2 <= lVar3) break;
        if (pppsVar1 == (sunrealtype ***)0x0) {
          bVar5 = false;
        }
        else {
          uVar10 = (ulong)(uint)MRIC->nmat;
          if (MRIC->nmat < 1) {
            uVar10 = 0;
          }
          dVar11 = 0.0;
          for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
            for (uVar8 = 0; iVar2 + 1 != uVar8; uVar8 = uVar8 + 1) {
              dVar11 = dVar11 + ABS(pppsVar1[uVar7][uVar8][lVar3]);
            }
          }
          bVar5 = 2.220446049250313e-14 < dVar11;
        }
        if (MRIC->G == (sunrealtype ***)0x0) {
          bVar4 = false;
        }
        else {
          uVar10 = (ulong)(uint)MRIC->nmat;
          if (MRIC->nmat < 1) {
            uVar10 = 0;
          }
          dVar11 = 0.0;
          for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
            for (lVar9 = 0; lVar9 <= iVar2; lVar9 = lVar9 + 1) {
              dVar11 = dVar11 + ABS(MRIC->G[uVar7][lVar9][lVar3]);
            }
          }
          bVar4 = 2.220446049250313e-14 < dVar11;
        }
        iVar2 = -1;
        if ((bool)(bVar5 | bVar4)) {
          iVar2 = iVar6;
        }
        iVar6 = iVar6 + (uint)(byte)(bVar5 | bVar4);
        stage_map[lVar3] = iVar2;
        lVar3 = lVar3 + 1;
      }
      iVar2 = -0x16;
      if (iVar6 != 0) {
        *nstages_active = iVar6;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC, int* stage_map,
                                int* nstages_active)
{
  int i, j, k, idx;
  sunrealtype Wsum, Gsum;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) { return (ARK_ILL_INPUT); }
  if (!(MRIC->W) && !(MRIC->G)) { return (ARK_ILL_INPUT); }
  if (!stage_map || !nstages_active) { return (ARK_ILL_INPUT); }

  /* -------------------------------------------
   * MERK and MRI-SR have "identity" storage map
   * ------------------------------------------- */

  if ((MRIC->type == MRISTEP_MERK) || (MRIC->type == MRISTEP_SR))
  {
    /* Number of stage RHS vectors active */
    *nstages_active = MRIC->stages;

    /* Create an identity map (all columns are non-zero) */
    for (j = 0; j < MRIC->stages; j++) { stage_map[j] = j; }
    return (ARK_SUCCESS);
  }

  /* ----------------------------------------
   * Compute storage map for MRI-GARK methods
   * ---------------------------------------- */

  /* Number of stage RHS vectors active */
  *nstages_active = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++)
  {
    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i <= MRIC->stages; i++)
        {
          Wsum += SUNRabs(MRIC->W[k][i][j]);
        }
      }
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i <= MRIC->stages; i++)
        {
          Gsum += SUNRabs(MRIC->G[k][i][j]);
        }
      }
    }

    if (Wsum > tol || Gsum > tol)
    {
      stage_map[j] = idx;
      idx++;
    }
    else { stage_map[j] = -1; }
  }

  /* Check and set number of stage RHS vectors active */
  if (idx < 1) { return (ARK_ILL_INPUT); }

  *nstages_active = idx;

  return (ARK_SUCCESS);
}